

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_blancer.hpp
# Opt level: O0

int __thiscall
coro_io::load_blancer<cinatra::coro_http_client,_coro_io::io_context_pool>::WRRLoadBlancer::
select_host_with_weight_round_robin(WRRLoadBlancer *this)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  vector<int,_std::allocator<int>_> *in_RDI;
  
  while( true ) {
    iVar1 = *(int *)&in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    sVar2 = std::vector<int,_std::allocator<int>_>::size(in_RDI);
    *(int *)&in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish = (int)((ulong)(long)(iVar1 + 1) % sVar2);
    if (((*(int *)&in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish == 0) &&
        (*(int *)((long)&in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish + 4) =
              *(int *)((long)&in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish + 4) -
              *(int *)&in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,
        *(int *)((long)&in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 4) < 1)) &&
       (*(undefined4 *)
         ((long)&in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 4) =
             *(undefined4 *)
              ((long)&in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + 4),
       *(int *)((long)&in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish + 4) == 0)) break;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       (in_RDI,(long)*(int *)&in_RDI[1].
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_finish);
    if (*(int *)((long)&in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 4) <= *pvVar3) {
      return *(int *)&in_RDI[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
    }
  }
  return -1;
}

Assistant:

int select_host_with_weight_round_robin() {
      while (true) {
        wrr_current_ = (wrr_current_ + 1) % weights_.size();
        if (wrr_current_ == 0) {
          weight_current_ = weight_current_ - max_gcd_;
          if (weight_current_ <= 0) {
            weight_current_ = max_weight_;
            if (weight_current_ == 0) {
              return -1;  // can't find max weight server
            }
          }
        }

        if (weights_[wrr_current_] >= weight_current_) {
          return wrr_current_;
        }
      }
    }